

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O0

void __thiscall
crnlib::threaded_resampler::threaded_resampler(threaded_resampler *this,task_pool *tp)

{
  task_pool *tp_local;
  threaded_resampler *this_local;
  
  this->m_pTask_pool = tp;
  this->m_pParams = (params *)0x0;
  this->m_pX_contribs = (Contrib_List *)0x0;
  this->m_pY_contribs = (Contrib_List *)0x0;
  this->m_bytes_per_pixel = 0;
  vector<crnlib::vec<4U,_float>_>::vector(&this->m_tmp_img);
  return;
}

Assistant:

threaded_resampler::threaded_resampler(task_pool& tp) :
        m_pTask_pool(&tp),
        m_pParams(nullptr),
        m_pX_contribs(nullptr),
        m_pY_contribs(nullptr),
        m_bytes_per_pixel(0)
    {
    }